

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntConstMath.cpp
# Opt level: O1

bool IntConstMath::Mul(IntConstType left,IntConstType right,IRType type,IntConstType *result)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = Int64Math::Mul(left,right,result);
  bVar2 = true;
  if (!bVar1) {
    bVar2 = IsValid(*result,type);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool IntConstMath::Mul(IntConstType left, IntConstType right, IRType type, IntConstType * result)
{
#if TARGET_32
    bool overflowed = Int32Math::Mul(left, right, result);
    CompileAssert(sizeof(IntConstType) == sizeof(int32));
#elif TARGET_64
    bool overflowed = Int64Math::Mul(left, right, result);
    CompileAssert(sizeof(IntConstType) == sizeof(int64));
#endif
    return overflowed || !IsValid(*result, type);
}